

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileperblock_file.cpp
# Opt level: O3

void __thiscall
foxxll::fileperblock_file<foxxll::mmap_file>::lock(fileperblock_file<foxxll::mmap_file> *this)

{
  long lVar1;
  void *offset;
  char *__function;
  counting_ptr<foxxll::mmap_file> *this_00;
  ufs_file_base *this_01;
  request_ptr r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_1c;
  
  this_01 = &((this->lock_file_).ptr_)->super_ufs_file_base;
  if (this_01 != (ufs_file_base *)0x0) {
LAB_00137119:
    ufs_file_base::lock(this_01);
    return;
  }
  lVar1 = *(long *)&(this->super_disk_queued_file).field_0x10;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,lVar1,*(long *)&(this->super_disk_queued_file).field_0x18 + lVar1);
  std::__cxx11::string::append((char *)&local_48);
  local_1c = (*(this->super_disk_queued_file)._vptr_disk_queued_file[2])(this);
  tlx::make_counting<foxxll::mmap_file,std::__cxx11::string,int&,int>
            ((tlx *)local_50,&local_48,(int *)&(this->super_disk_queued_file).field_0x30,&local_1c);
  this_00 = &this->lock_file_;
  if ((undefined1  [8])this_00->ptr_ != local_50) {
    tlx::CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter>::dec_reference(this_00);
    this_00->ptr_ = (mmap_file *)local_50;
    local_50 = (undefined1  [8])0x0;
  }
  tlx::CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter>::dec_reference
            ((CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter> *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  offset = aligned_alloc<4096ul>(0x1000,0);
  if (&this_00->ptr_->super_ufs_file_base != (ufs_file_base *)0x0) {
    ufs_file_base::set_size(&this_00->ptr_->super_ufs_file_base,0x1000);
    if (this_00->ptr_ != (mmap_file *)0x0) {
      local_48.field_2._M_allocated_capacity = 0;
      local_48.field_2._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48._M_dataplus._M_p = (pointer)0x0;
      local_48._M_string_length = 0;
      disk_queued_file::awrite
                ((disk_queued_file *)local_50,&(this_00->ptr_->super_ufs_file_base).field_0x60,
                 (offset_type)offset,0,(completion_handler *)0x1000);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.field_2._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.field_2._8_8_);
      }
      if (local_50 == (undefined1  [8])0x0) {
        __function = 
        "Type *tlx::CountingPtr<foxxll::request>::operator->() const [Type = foxxll::request, Deleter = tlx::CountingPtrDefaultDeleter]"
        ;
        goto LAB_00137154;
      }
      (**(code **)(*(long *)((long)&((ufs_file_base *)local_50)->_vptr_ufs_file_base +
                            *(long *)(*(long *)local_50 + -0x68)) + 0x30))
                ((long)&((ufs_file_base *)local_50)->_vptr_ufs_file_base +
                 *(long *)(*(long *)local_50 + -0x68),1);
      if (offset != (void *)0x0) {
        free(*(void **)((long)offset + -8));
      }
      tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_50);
      this_01 = &this_00->ptr_->super_ufs_file_base;
      if (this_01 != (ufs_file_base *)0x0) goto LAB_00137119;
    }
  }
  __function = 
  "Type *tlx::CountingPtr<foxxll::mmap_file>::operator->() const [Type = foxxll::mmap_file, Deleter = tlx::CountingPtrDefaultDeleter]"
  ;
LAB_00137154:
  __assert_fail("ptr_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/extlib/tlx/tlx/counting_ptr.hpp"
                ,0xc5,__function);
}

Assistant:

void fileperblock_file<base_file_type>::lock()
{
    if (!lock_file_)
    {
        lock_file_ = tlx::make_counting<base_file_type>(
                filename_prefix_ + "_fpb_lock", mode_, get_queue_id()
            );

        //create lock file and fill it with one page, an empty file cannot be locked
        const int page_size = BlockAlignment;
        void* one_page = aligned_alloc<BlockAlignment>(page_size);
#if FOXXLL_WITH_VALGRIND
        memset(one_page, 0, page_size);
#endif
        lock_file_->set_size(page_size);
        request_ptr r = lock_file_->awrite(one_page, 0, page_size);
        r->wait();
        aligned_dealloc<BlockAlignment>(one_page);
    }
    lock_file_->lock();
}